

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ItaniumDemangle.cpp
# Opt level: O1

ReferenceType * __thiscall
(anonymous_namespace)::Db::
make<(anonymous_namespace)::ReferenceType,(anonymous_namespace)::Node*&,(anonymous_namespace)::ReferenceKind>
          (Db *this,Node **args,ReferenceKind *args_1)

{
  Cache CVar1;
  ReferenceKind RVar2;
  Node *pNVar3;
  ReferenceType *pRVar4;
  
  pRVar4 = (ReferenceType *)
           anon_unknown.dwarf_5e4c5e::BumpPointerAllocator::allocate
                     ((BumpPointerAllocator *)(this + 0x2f0),0x20);
  pNVar3 = *args;
  RVar2 = *args_1;
  CVar1 = pNVar3->RHSComponentCache;
  (pRVar4->super_Node).K = KReferenceType;
  (pRVar4->super_Node).RHSComponentCache = CVar1;
  (pRVar4->super_Node).ArrayCache = No;
  (pRVar4->super_Node).FunctionCache = No;
  (pRVar4->super_Node)._vptr_Node = (_func_int **)&PTR_hasRHSComponentSlow_00245c30;
  pRVar4->Pointee = pNVar3;
  pRVar4->RK = RVar2;
  pRVar4->Printing = false;
  return pRVar4;
}

Assistant:

T *make(Args &&... args) {
    return new (ASTAllocator.allocate(sizeof(T)))
        T(std::forward<Args>(args)...);
  }